

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc3::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc3 *this,EvalContext *ctx,Interval *xi,
          Interval *yi,Interval *zi)

{
  byte bVar1;
  deRoundingMode dVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ulong uVar13;
  Interval reti;
  byte local_198 [8];
  double local_190;
  double local_188;
  byte local_179;
  double local_178;
  ulong uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  ulong uStack_150;
  double local_148;
  ulong uStack_140;
  double local_138;
  ulong uStack_130;
  double local_128;
  ulong uStack_120;
  double local_118;
  ulong uStack_110;
  double local_108;
  ulong uStack_100;
  double local_f8;
  ulong uStack_f0;
  double local_e8;
  ulong uStack_e0;
  double local_d8;
  ulong uStack_d0;
  double local_c8;
  ulong uStack_c0;
  Interval local_b0;
  double local_98;
  ulong uStack_90;
  double local_88;
  ulong uStack_80;
  double local_78;
  ulong uStack_70;
  Interval *local_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_b0.m_hasNaN = false;
  local_b0.m_lo = INFINITY;
  local_b0.m_hi = -INFINITY;
  local_168 = xi->m_lo;
  if (local_168 < xi->m_hi || local_168 == xi->m_hi) {
    dVar7 = yi->m_lo;
    local_60 = __return_storage_ptr__;
    if (dVar7 < yi->m_hi || dVar7 == yi->m_hi) {
      dVar10 = zi->m_lo;
      if (dVar10 < zi->m_hi || dVar10 == zi->m_hi) {
        local_178 = dVar7;
        local_158 = dVar10;
        dVar2 = deGetRoundingMode();
        local_128._0_4_ = dVar2;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_158,local_198,this,ctx);
        local_98 = (double)CONCAT71(local_98._1_7_,local_198[0]);
        local_138 = local_190;
        uStack_130 = 0;
        local_148 = local_188;
        uStack_140 = 0;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_158,local_198,this,ctx);
        local_c8 = (double)CONCAT71(local_c8._1_7_,local_198[0]);
        local_e8 = local_190;
        uStack_e0 = 0;
        local_d8 = local_188;
        uStack_d0 = 0;
        deSetRoundingMode(local_128._0_4_);
        local_158 = zi->m_hi;
        dVar2 = deGetRoundingMode();
        local_128 = (double)CONCAT44(local_128._4_4_,dVar2);
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_158,local_198,this,ctx);
        local_108 = (double)CONCAT71(local_108._1_7_,local_198[0]);
        local_f8 = local_190;
        uStack_f0 = 0;
        local_118 = local_188;
        uStack_110 = 0;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_158,local_198,this,ctx);
        bVar4 = local_198[0];
        local_178 = local_190;
        uStack_170 = 0;
        local_158 = local_188;
        uStack_150 = 0;
        deSetRoundingMode(local_128._0_4_);
        dVar7 = (double)(~-(ulong)(local_138 <= local_e8) & (ulong)local_e8 |
                        (ulong)local_138 & -(ulong)(local_138 <= local_e8));
        uVar6 = ~uStack_130 & uStack_e0 | uStack_130;
        dVar10 = (double)(~-(ulong)(local_d8 <= local_148) & (ulong)local_d8 |
                         (ulong)local_148 & -(ulong)(local_d8 <= local_148));
        dVar11 = (double)(~-(ulong)(local_158 <= local_118) & (ulong)local_158 |
                         (ulong)local_118 & -(ulong)(local_158 <= local_118));
        if (((ulong)local_108 & 1) != 0) {
          bVar4 = 1;
        }
        dVar12 = (double)(~-(ulong)(local_f8 <= local_178) & (ulong)local_178 |
                         (ulong)local_f8 & -(ulong)(local_f8 <= local_178));
        if (((local_98._0_1_ | local_c8._0_1_) & 1) != 0) {
          bVar4 = 1;
        }
        uVar5 = -(ulong)(dVar7 <= dVar12);
        dVar7 = (double)(uVar5 & (ulong)dVar7 | ~uVar5 & (ulong)dVar12);
        uVar6 = uVar6 | ~uVar6 & (~uStack_f0 & uStack_170 | uStack_f0);
        uVar13 = -(ulong)(dVar11 <= dVar10);
        uVar5 = uStack_110 & uStack_150 & uStack_140 & uStack_d0;
        dVar10 = (double)(uVar13 & (ulong)dVar10 | ~uVar13 & (ulong)dVar11);
      }
      else {
        dVar10 = -INFINITY;
        uVar5 = 0;
        dVar7 = INFINITY;
        uVar6 = 0;
        bVar4 = 0;
      }
      if (zi->m_hasNaN == true) {
        if (INFINITY <= dVar7) {
          dVar7 = INFINITY;
        }
        if (dVar10 <= -INFINITY) {
          dVar10 = -INFINITY;
        }
        bVar4 = 1;
      }
      dVar11 = zi->m_lo;
      if (dVar11 < zi->m_hi || dVar11 == zi->m_hi) {
        local_178 = yi->m_hi;
        local_158 = dVar11;
        local_148 = dVar7;
        uStack_140 = uVar6;
        local_98 = dVar10;
        uStack_90 = uVar5;
        dVar2 = deGetRoundingMode();
        local_128._0_4_ = dVar2;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_158,local_198,this,ctx);
        local_138 = (double)CONCAT71(local_138._1_7_,local_198[0]);
        local_d8 = local_190;
        uStack_d0 = 0;
        local_c8 = local_188;
        uStack_c0 = 0;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_158,local_198,this,ctx);
        local_e8 = (double)CONCAT71(local_e8._1_7_,local_198[0]);
        local_108 = local_190;
        uStack_100 = 0;
        local_f8 = local_188;
        uStack_f0 = 0;
        deSetRoundingMode(local_128._0_4_);
        local_158 = zi->m_hi;
        dVar2 = deGetRoundingMode();
        local_128 = (double)CONCAT44(local_128._4_4_,dVar2);
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_158,local_198,this,ctx);
        local_78 = (double)CONCAT71(local_78._1_7_,local_198[0]);
        local_118 = local_190;
        uStack_110 = 0;
        local_88 = local_188;
        uStack_80 = 0;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_158,local_198,this,ctx);
        local_168 = (double)CONCAT71(local_168._1_7_,local_198[0]);
        local_178 = local_190;
        uStack_170 = 0;
        local_158 = local_188;
        uStack_150 = 0;
        deSetRoundingMode(local_128._0_4_);
        dVar7 = (double)(~-(ulong)(local_d8 <= local_108) & (ulong)local_108 |
                        (ulong)local_d8 & -(ulong)(local_d8 <= local_108));
        uVar13 = ~uStack_d0 & uStack_100 | uStack_d0;
        dVar10 = (double)(~-(ulong)(local_f8 <= local_c8) & (ulong)local_f8 |
                         (ulong)local_c8 & -(ulong)(local_f8 <= local_c8));
        dVar11 = (double)(~-(ulong)(local_158 <= local_88) & (ulong)local_158 |
                         (ulong)local_88 & -(ulong)(local_158 <= local_88));
        bVar1 = local_168._0_1_;
        if (((ulong)local_78 & 1) != 0) {
          bVar1 = 1;
        }
        dVar12 = (double)(~-(ulong)(local_118 <= local_178) & (ulong)local_178 |
                         (ulong)local_118 & -(ulong)(local_118 <= local_178));
        if (((local_138._0_1_ | local_e8._0_1_) & 1) != 0) {
          bVar1 = 1;
        }
        uVar6 = -(ulong)(dVar7 <= dVar12);
        dVar12 = (double)(uVar6 & (ulong)dVar7 | ~uVar6 & (ulong)dVar12);
        uVar13 = uVar13 | ~uVar13 & (~uStack_110 & uStack_170 | uStack_110);
        uVar6 = -(ulong)(dVar11 <= dVar10);
        uVar8 = uStack_80 & uStack_150 & uStack_c0 & uStack_f0;
        dVar11 = (double)(uVar6 & (ulong)dVar10 | ~uVar6 & (ulong)dVar11);
        dVar7 = local_148;
        uVar6 = uStack_140;
        dVar10 = local_98;
        uVar5 = uStack_90;
      }
      else {
        dVar11 = -INFINITY;
        uVar8 = 0;
        dVar12 = INFINITY;
        uVar13 = 0;
        bVar1 = 0;
      }
      if (zi->m_hasNaN == true) {
        if (INFINITY <= dVar12) {
          dVar12 = INFINITY;
        }
        if (dVar11 <= -INFINITY) {
          dVar11 = -INFINITY;
        }
        bVar1 = 1;
      }
      uVar3 = 1;
      if ((bVar4 & 1) == 0) {
        uVar3 = (ulong)bVar1;
      }
      dVar12 = (double)(~-(ulong)(dVar7 <= dVar12) & (ulong)dVar12 |
                       (ulong)dVar7 & -(ulong)(dVar7 <= dVar12));
      uVar6 = ~uVar6 & uVar13 | uVar6;
      uVar5 = uVar5 & uVar8;
      dVar7 = (double)(~-(ulong)(dVar11 <= dVar10) & (ulong)dVar11 |
                      (ulong)dVar10 & -(ulong)(dVar11 <= dVar10));
    }
    else {
      dVar7 = -INFINITY;
      uVar5 = 0;
      dVar12 = INFINITY;
      uVar6 = 0;
      uVar3 = 0;
    }
    if (yi->m_hasNaN == true) {
      if (INFINITY <= dVar12) {
        dVar12 = INFINITY;
      }
      if (dVar7 <= -INFINITY) {
        dVar7 = -INFINITY;
      }
      uVar3 = 1;
    }
    dVar10 = yi->m_lo;
    if (dVar10 < yi->m_hi || dVar10 == yi->m_hi) {
      local_168 = xi->m_hi;
      dVar11 = zi->m_lo;
      local_98 = (double)CONCAT44(local_98._4_4_,(int)uVar3);
      local_158 = dVar7;
      uStack_150 = uVar5;
      local_128 = dVar12;
      uStack_120 = uVar6;
      if (dVar11 < zi->m_hi || dVar11 == zi->m_hi) {
        local_178 = dVar10;
        local_148 = dVar11;
        dVar2 = deGetRoundingMode();
        local_138._0_4_ = dVar2;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_148,local_198,this,ctx);
        local_c8 = (double)CONCAT71(local_c8._1_7_,local_198[0]);
        local_e8 = local_190;
        uStack_e0 = 0;
        local_d8 = local_188;
        uStack_d0 = 0;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_148,local_198,this,ctx);
        local_f8 = (double)CONCAT71(local_f8._1_7_,local_198[0]);
        local_118 = local_190;
        uStack_110 = 0;
        local_108 = local_188;
        uStack_100 = 0;
        deSetRoundingMode(local_138._0_4_);
        local_148 = zi->m_hi;
        dVar2 = deGetRoundingMode();
        local_138 = (double)CONCAT44(local_138._4_4_,dVar2);
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_148,local_198,this,ctx);
        local_88 = (double)CONCAT71(local_88._1_7_,local_198[0]);
        local_78 = local_190;
        uStack_70 = 0;
        local_58 = local_188;
        uStack_50 = 0;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_148,local_198,this,ctx);
        bVar4 = local_198[0];
        local_178 = local_190;
        uStack_170 = 0;
        local_148 = local_188;
        uStack_140 = 0;
        deSetRoundingMode(local_138._0_4_);
        dVar7 = (double)(~-(ulong)(local_e8 <= local_118) & (ulong)local_118 |
                        (ulong)local_e8 & -(ulong)(local_e8 <= local_118));
        uVar6 = ~uStack_e0 & uStack_110 | uStack_e0;
        dVar10 = (double)(~-(ulong)(local_108 <= local_d8) & (ulong)local_108 |
                         (ulong)local_d8 & -(ulong)(local_108 <= local_d8));
        dVar11 = (double)(~-(ulong)(local_148 <= local_58) & (ulong)local_148 |
                         (ulong)local_58 & -(ulong)(local_148 <= local_58));
        if (((ulong)local_88 & 1) != 0) {
          bVar4 = 1;
        }
        dVar12 = (double)(~-(ulong)(local_78 <= local_178) & (ulong)local_178 |
                         (ulong)local_78 & -(ulong)(local_78 <= local_178));
        if (((local_c8._0_1_ | local_f8._0_1_) & 1) != 0) {
          bVar4 = 1;
        }
        uVar5 = -(ulong)(dVar7 <= dVar12);
        dVar12 = (double)(uVar5 & (ulong)dVar7 | ~uVar5 & (ulong)dVar12);
        uVar6 = uVar6 | ~uVar6 & (~uStack_70 & uStack_170 | uStack_70);
        uVar5 = -(ulong)(dVar11 <= dVar10);
        uVar13 = uStack_50 & uStack_140 & uStack_d0 & uStack_100;
        dVar7 = (double)(uVar5 & (ulong)dVar10 | ~uVar5 & (ulong)dVar11);
        uVar3 = (ulong)local_98 & 0xffffffff;
      }
      else {
        dVar7 = -INFINITY;
        uVar13 = 0;
        dVar12 = INFINITY;
        uVar6 = 0;
        bVar4 = 0;
      }
      if (zi->m_hasNaN == true) {
        if (INFINITY <= dVar12) {
          dVar12 = INFINITY;
        }
        if (dVar7 <= -INFINITY) {
          dVar7 = -INFINITY;
        }
        bVar4 = 1;
      }
      dVar10 = zi->m_lo;
      if (dVar10 < zi->m_hi || dVar10 == zi->m_hi) {
        local_178 = yi->m_hi;
        local_148 = dVar10;
        local_d8 = dVar12;
        uStack_d0 = uVar6;
        local_c8 = dVar7;
        uStack_c0 = uVar13;
        dVar2 = deGetRoundingMode();
        local_138._0_4_ = dVar2;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_148,local_198,this,ctx);
        local_e8 = (double)CONCAT71(local_e8._1_7_,local_198[0]);
        local_108 = local_190;
        uStack_100 = 0;
        local_f8 = local_188;
        uStack_f0 = 0;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_148,local_198,this,ctx);
        local_118 = (double)CONCAT71(local_118._1_7_,local_198[0]);
        local_88 = local_190;
        uStack_80 = 0;
        local_78 = local_188;
        uStack_70 = 0;
        deSetRoundingMode(local_138._0_4_);
        local_148 = zi->m_hi;
        dVar2 = deGetRoundingMode();
        local_138 = (double)CONCAT44(local_138._4_4_,dVar2);
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_148,local_198,this,ctx);
        local_179 = local_198[0];
        local_58 = local_190;
        uStack_50 = 0;
        local_48 = local_188;
        uStack_40 = 0;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (**(code **)(*(long *)this + 0x58))(local_168,local_178,local_148,local_198,this,ctx);
        local_168 = local_190;
        uStack_160 = 0;
        local_178 = local_188;
        uStack_170 = 0;
        deSetRoundingMode(local_138._0_4_);
        dVar7 = (double)(~-(ulong)(local_108 <= local_88) & (ulong)local_88 |
                        (ulong)local_108 & -(ulong)(local_108 <= local_88));
        dVar10 = (double)(~-(ulong)(local_78 <= local_f8) & (ulong)local_78 |
                         (ulong)local_f8 & -(ulong)(local_78 <= local_f8));
        dVar11 = (double)(~-(ulong)(local_178 <= local_48) & (ulong)local_178 |
                         (ulong)local_48 & -(ulong)(local_178 <= local_48));
        if ((local_179 & 1) != 0) {
          local_198[0] = 1;
        }
        dVar12 = (double)(~-(ulong)(local_58 <= local_168) & (ulong)local_168 |
                         (ulong)local_58 & -(ulong)(local_58 <= local_168));
        if (((local_e8._0_1_ | local_118._0_1_) & 1) != 0) {
          local_198[0] = 1;
        }
        uVar6 = -(ulong)(dVar7 <= dVar12);
        dVar9 = (double)(uVar6 & (ulong)dVar7 | ~uVar6 & (ulong)dVar12);
        uVar6 = -(ulong)(dVar11 <= dVar10);
        dVar10 = (double)(uVar6 & (ulong)dVar10 | ~uVar6 & (ulong)dVar11);
        uVar3 = (ulong)local_98 & 0xffffffff;
        dVar7 = local_c8;
        dVar12 = local_d8;
      }
      else {
        dVar10 = -INFINITY;
        dVar9 = INFINITY;
        local_198[0] = 0;
      }
      if (zi->m_hasNaN == true) {
        if (INFINITY <= dVar9) {
          dVar9 = INFINITY;
        }
        if (dVar10 <= -INFINITY) {
          dVar10 = -INFINITY;
        }
        local_198[0] = 1;
      }
      bVar1 = 1;
      if ((bVar4 & 1) == 0) {
        bVar1 = local_198[0];
      }
      dVar11 = (double)(~-(ulong)(dVar12 <= dVar9) & (ulong)dVar9 |
                       (ulong)dVar12 & -(ulong)(dVar12 <= dVar9));
      dVar10 = (double)(~-(ulong)(dVar10 <= dVar7) & (ulong)dVar10 |
                       (ulong)dVar7 & -(ulong)(dVar10 <= dVar7));
      dVar7 = local_158;
      dVar12 = local_128;
    }
    else {
      dVar10 = -INFINITY;
      dVar11 = INFINITY;
      bVar1 = 0;
    }
    if (yi->m_hasNaN == true) {
      if (INFINITY <= dVar11) {
        dVar11 = INFINITY;
      }
      if (dVar10 <= -INFINITY) {
        dVar10 = -INFINITY;
      }
      bVar1 = 1;
    }
    local_b0.m_hasNaN = (bool)1;
    if ((uVar3 & 1) == 0) {
      local_b0.m_hasNaN = (bool)bVar1;
    }
    local_b0.m_lo =
         (double)(~-(ulong)(dVar12 <= dVar11) & (ulong)dVar11 |
                 (ulong)dVar12 & -(ulong)(dVar12 <= dVar11));
    local_b0.m_hi =
         (double)(~-(ulong)(dVar10 <= dVar7) & (ulong)dVar10 |
                 (ulong)dVar7 & -(ulong)(dVar10 <= dVar7));
    __return_storage_ptr__ = local_60;
  }
  else {
    local_b0.m_hi = -INFINITY;
    local_b0.m_lo = INFINITY;
    local_b0.m_hasNaN = false;
  }
  if (xi->m_hasNaN == true) {
    if (INFINITY <= local_b0.m_lo) {
      local_b0.m_lo = INFINITY;
    }
    if (local_b0.m_hi <= -INFINITY) {
      local_b0.m_hi = -INFINITY;
    }
    local_b0.m_hasNaN = true;
  }
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_b0);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext&	ctx,
										 const Interval&	xi,
										 const Interval&	yi,
										 const Interval&	zi) const
	{
		Interval reti;
		TCU_INTERVAL_APPLY_MONOTONE3(reti, x, xi, y, yi, z, zi, ret,
									 TCU_SET_INTERVAL(ret, point,
													  point = this->applyPoint(ctx, x, y, z)));
		return ctx.format.convert(reti);
	}